

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

HRESULT __thiscall
Js::SourceTextModuleRecord::PrepareForModuleDeclarationInitialization(SourceTextModuleRecord *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  char16 *pcVar4;
  JavascriptPromise **ppJVar5;
  ScriptContext *this_00;
  ThreadContext *pTVar6;
  undefined4 *puVar7;
  void **ppvVar8;
  HostScriptContext *pHVar9;
  Data local_70 [2];
  Data __exceptionCheck;
  undefined1 local_60 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  ScriptContext *scriptContext;
  HRESULT hr;
  SourceTextModuleRecord *this_local;
  
  pcVar4 = GetSpecifierSz(this);
  Output::TraceWithFlush(ModulePhase,L"PrepareForModuleDeclarationInitialization(%s)\n",pcVar4);
  scriptContext._4_4_ = 0;
  bVar2 = ConfirmChildrenParsed(this);
  if (bVar2) {
    Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentsAsNeeded\n");
    NotifyParentsAsNeeded(this);
    bVar2 = WasDeclarationInitialized(this);
    if ((!bVar2) &&
       (((this->isRootModule & 1U) != 0 ||
        (ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromise__
                             ((WriteBarrierPtr *)&this->promise),
        *ppJVar5 != (JavascriptPromise *)0x0)))) {
      this_00 = GetScriptContext(this);
      pTVar6 = ScriptContext::GetThreadContext(this_00);
      bVar2 = ThreadContext::IsScriptActive(pTVar6);
      if ((bVar2) &&
         (ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromise__
                              ((WriteBarrierPtr *)&this->promise),
         *ppJVar5 == (JavascriptPromise *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x179,
                                    "(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr)"
                                    ,
                                    "!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      uVar3 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])();
      if ((uVar3 & 1) != 0) {
        (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0xb])();
      }
      ppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&this->errorObject);
      if (*ppvVar8 != (void *)0x0) {
        ReleaseParserResourcesForHierarchy(this);
      }
      if (((this->hadNotifyHostReady & 1U) == 0) &&
         (bVar2 = ModuleRecordBase::WasEvaluated(&this->super_ModuleRecordBase), !bVar2)) {
        pcVar4 = GetSpecifierSz(this);
        Output::TraceWithFlush
                  (ModulePhase,
                   L"\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"
                   ,pcVar4);
        pTVar6 = ScriptContext::GetThreadContext(this_00);
        bVar2 = ThreadContext::IsScriptActive(pTVar6);
        if (bVar2) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)
                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled,this_00,&this_local);
          pTVar6 = ScriptContext::GetThreadContext(this_00);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_60,pTVar6);
          pHVar9 = ScriptContext::GetHostScriptContext(this_00);
          ppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)&this->errorObject);
          scriptContext._4_4_ = (*pHVar9->_vptr_HostScriptContext[0x14])(pHVar9,this,*ppvVar8);
          if (this_00 != (ScriptContext *)0x0) {
            pTVar6 = ScriptContext::GetThreadContext(this_00);
            ThreadContext::DisposeOnLeaveScript(pTVar6);
          }
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_60);
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)
                     &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
        }
        else {
          local_70[0] = ExceptionCheck::Save();
          pHVar9 = ScriptContext::GetHostScriptContext(this_00);
          ppvVar8 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)&this->errorObject);
          scriptContext._4_4_ = (*pHVar9->_vptr_HostScriptContext[0x14])(pHVar9,this,*ppvVar8);
          ExceptionCheck::Restore(local_70);
        }
        this->hadNotifyHostReady = true;
      }
    }
  }
  return scriptContext._4_4_;
}

Assistant:

HRESULT SourceTextModuleRecord::PrepareForModuleDeclarationInitialization()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("PrepareForModuleDeclarationInitialization(%s)\n"), this->GetSpecifierSz());
        HRESULT hr = NO_ERROR;

        if (ConfirmChildrenParsed())
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentsAsNeeded\n"));
            NotifyParentsAsNeeded();

            if (!WasDeclarationInitialized() && (isRootModule || promise != nullptr))
            {
                // TODO: move this as a promise call? if parser is called from a different thread
                // We'll need to call the bytecode gen in the main thread as we are accessing GC.
                ScriptContext* scriptContext = GetScriptContext();
                Assert(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr);

                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                }

                if (!hadNotifyHostReady && !WasEvaluated())
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"), this->GetSpecifierSz());
                    LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                    {
                        hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                    });

                    hadNotifyHostReady = true;
                }
            }
        }
        return hr;
    }